

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolu.c
# Opt level: O0

int ffprwu(fitsfile *fptr,LONGLONG firstrow,LONGLONG nrows,int *status)

{
  int *in_RCX;
  long in_RDX;
  fitsfile *in_RSI;
  int nullstatus;
  LONGLONG width;
  LONGLONG repeat;
  int typecode;
  int i;
  int ncols;
  LONGLONG ntotrows;
  int *in_stack_000001d0;
  LONGLONG in_stack_000001d8;
  LONGLONG in_stack_000001e0;
  LONGLONG in_stack_000001e8;
  int in_stack_000001f4;
  fitsfile *in_stack_000001f8;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar1;
  int *ncols_00;
  fitsfile *fptr_00;
  uint in_stack_ffffffffffffffc0;
  int iVar2;
  int in_stack_ffffffffffffffcc;
  LONGLONG *in_stack_ffffffffffffffd0;
  int local_4;
  
  fptr_00 = (fitsfile *)0x0;
  ncols_00 = (int *)0x0;
  if (*in_RCX < 1) {
    if (((long)in_RSI < 1) || (in_RDX < 1)) {
      *in_RCX = 0x133;
      local_4 = 0x133;
    }
    else {
      ffgnrwll((fitsfile *)0x0,(LONGLONG *)0x0,
               (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if ((long)in_stack_ffffffffffffffd0 < (long)in_RSI + in_RDX + -1) {
        *in_RCX = 0x133;
        local_4 = 0x133;
      }
      else {
        ffgncl(fptr_00,ncols_00,(int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
              );
        if (*in_RCX == 0) {
          iVar2 = 1;
          while ((iVar2 <= in_stack_ffffffffffffffcc &&
                 (ffgtclll(in_RSI,(int)((ulong)in_RDX >> 0x20),in_RCX,in_stack_ffffffffffffffd0,
                           (LONGLONG *)CONCAT44(in_stack_ffffffffffffffcc,iVar2),
                           (int *)(ulong)in_stack_ffffffffffffffc0), *in_RCX == 0))) {
            iVar1 = 0;
            ffpclu(in_stack_000001f8,in_stack_000001f4,in_stack_000001e8,in_stack_000001e0,
                   in_stack_000001d8,in_stack_000001d0);
            if ((iVar1 != 0) && (iVar1 != 0x13a)) {
              *in_RCX = iVar1;
              return iVar1;
            }
            iVar2 = iVar2 + 1;
          }
          local_4 = *in_RCX;
        }
        else {
          local_4 = *in_RCX;
        }
      }
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffprwu(fitsfile *fptr,
           LONGLONG firstrow,
           LONGLONG nrows, 
           int *status)

/* 
 * fits_write_nullrows / ffprwu - write TNULLs to all columns in one or more rows
 *
 * fitsfile *fptr - pointer to FITS HDU opened for read/write
 * long int firstrow - first table row to set to null. (firstrow >= 1)
 * long int nrows - total number or rows to set to null. (nrows >= 1)
 * int *status - upon return, *status contains CFITSIO status code
 *
 * RETURNS: CFITSIO status code
 *
 * written by Craig Markwardt, GSFC 
 */
{
  LONGLONG ntotrows;
  int ncols, i;
  int typecode = 0;
  LONGLONG repeat = 0, width = 0;
  int nullstatus;

  if (*status > 0) return *status;

  if ((firstrow <= 0) || (nrows <= 0)) return (*status = BAD_ROW_NUM);

  fits_get_num_rowsll(fptr, &ntotrows, status);

  if (firstrow + nrows - 1 > ntotrows) return (*status = BAD_ROW_NUM);
  
  fits_get_num_cols(fptr, &ncols, status);
  if (*status) return *status;


  /* Loop through each column and write nulls */
  for (i=1; i <= ncols; i++) {
    repeat = 0;  typecode = 0;  width = 0;
    fits_get_coltypell(fptr, i, &typecode, &repeat, &width, status);
    if (*status) break;

    /* NOTE: data of TSTRING type must not write the total repeat
       count, since the repeat count is the *character* count, not the
       nstring count.  Divide by string width to get number of
       strings. */
    
    if (typecode == TSTRING) repeat /= width;

    /* Write NULLs */
    nullstatus = 0;
    fits_write_col_null(fptr, i, firstrow, 1, repeat*nrows, &nullstatus);

    /* ignore error if no null value is defined for the column */
    if (nullstatus && nullstatus != NO_NULL) return (*status = nullstatus);
    
  }
    
  return *status;
}